

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  bool bVar1;
  int *piVar2;
  bool local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c4;
  DiskSourceTree *local_c0;
  ZeroCopyInputStream *stream;
  string temp_disk_file;
  Mapping *mapping;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  *__range2;
  string local_68;
  string local_48;
  string *local_28;
  string *disk_file_local;
  string *virtual_file_local;
  DiskSourceTree *this_local;
  
  local_28 = disk_file;
  disk_file_local = virtual_file;
  virtual_file_local = (string *)this;
  std::__cxx11::string::string((string *)&local_68,(string *)virtual_file);
  CanonicalizePath(&local_48,&local_68);
  bVar1 = std::operator!=(virtual_file,&local_48);
  local_101 = true;
  if (!bVar1) {
    local_101 = ContainsParentReference(disk_file_local);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_101 == false) {
    __end2 = std::
             vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ::begin(&this->mappings_);
    mapping = (Mapping *)
              std::
              vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
              ::end(&this->mappings_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<google::protobuf::compiler::DiskSourceTree::Mapping_*,_std::vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>_>
                                       *)&mapping), bVar1) {
      temp_disk_file.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<google::protobuf::compiler::DiskSourceTree::Mapping_*,_std::vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string((string *)&stream);
      bVar1 = ApplyMapping(disk_file_local,(string *)temp_disk_file.field_2._8_8_,
                           (string *)(temp_disk_file.field_2._8_8_ + 0x20),(string *)&stream);
      if (bVar1) {
        local_c0 = (DiskSourceTree *)OpenDiskFile(this,(string *)&stream);
        if (local_c0 == (DiskSourceTree *)0x0) {
          piVar2 = __errno_location();
          if (*piVar2 != 0xd) goto LAB_0062c94b;
          std::operator+(&local_e8,"Read access is denied for file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream);
          std::__cxx11::string::operator=((string *)&this->last_error_message_,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          this_local = (DiskSourceTree *)0x0;
          local_c4 = 1;
        }
        else {
          if (local_28 != (string *)0x0) {
            std::__cxx11::string::operator=((string *)local_28,(string *)&stream);
          }
          this_local = local_c0;
          local_c4 = 1;
        }
      }
      else {
LAB_0062c94b:
        local_c4 = 0;
      }
      std::__cxx11::string::~string((string *)&stream);
      if (local_c4 != 0) {
        return (ZeroCopyInputStream *)this_local;
      }
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::DiskSourceTree::Mapping_*,_std::vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator=((string *)&this->last_error_message_,"File not found.");
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->last_error_message_,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
              );
  }
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const std::string& virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return NULL;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            "Read access is denied for file: " + temp_disk_file;
        return NULL;
      }
    }
  }
  last_error_message_ = "File not found.";
  return NULL;
}